

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::PeerManagerImpl::
MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CBlock_const>>
          (PeerManagerImpl *this,CNode *node,string *msg_type,
          ParamsWrapper<TransactionSerParams,_const_CBlock> *args)

{
  CConnman *this_00;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff78;
  CSerializedNetMsg local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(CConnman **)(this + 0x100);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff80,msg_type);
  NetMsg::Make<ParamsWrapper<TransactionSerParams,CBlock_const>>
            (&local_60,(NetMsg *)&stack0xffffffffffffff80,in_stack_ffffffffffffff78,args);
  CConnman::PushMessage(this_00,node,&local_60);
  CSerializedNetMsg::~CSerializedNetMsg(&local_60);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MakeAndPushMessage(CNode& node, std::string msg_type, Args&&... args) const
    {
        m_connman.PushMessage(&node, NetMsg::Make(std::move(msg_type), std::forward<Args>(args)...));
    }